

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  long lVar1;
  int64_t iVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  TypeCase TVar6;
  int iVar7;
  ShapeFlexibilityCase SVar8;
  int iVar9;
  ArrayFeatureType_ArrayDataType AVar10;
  DefaultOptionalValueCase DVar11;
  KeyTypeCase KVar12;
  SizeFlexibilityCase SVar13;
  ImageFeatureType_ColorSpace IVar14;
  TypeCase TVar15;
  string *psVar16;
  ArrayFeatureType *pAVar17;
  ArrayFeatureType_EnumeratedShapes *pAVar18;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *pRVar19;
  ArrayFeatureType_ShapeRange *this;
  long *plVar20;
  uint64 uVar21;
  int64 iVar22;
  DictionaryFeatureType *this_00;
  ImageFeatureType *pIVar23;
  ImageFeatureType_EnumeratedImageSizes *pIVar24;
  ImageFeatureType_ImageSize *pIVar25;
  RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize> *this_01;
  ImageFeatureType_ImageSizeRange *pIVar26;
  uint64 uVar27;
  SequenceFeatureType *pSVar28;
  SizeRange *pSVar29;
  bool local_ed9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  undefined1 local_db0 [64];
  undefined1 local_d70 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  undefined1 local_d10 [40];
  Result res_2;
  undefined1 local_ca8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  undefined1 local_c48 [64];
  undefined1 local_c08 [32];
  undefined1 local_be8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  undefined1 local_b68 [32];
  undefined1 local_b48 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  undefined1 local_ac8 [32];
  undefined1 local_aa8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  undefined1 local_a28 [32];
  undefined1 local_a08 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  undefined1 local_988 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined1 local_928 [72];
  SizeRange *local_8e0;
  SizeRange *heightRange;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  undefined1 local_898 [72];
  SizeRange *local_850;
  SizeRange *widthRange;
  undefined1 local_828 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  string local_768;
  ImageFeatureType_ImageSize *size;
  const_iterator __end5_2;
  const_iterator __begin5_2;
  RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize> *__range5_2;
  undefined1 local_720 [7];
  bool foundDefault_1;
  string local_700;
  uint64 uStack_6d8;
  bool hasDefault;
  int64_t defaultHeight;
  int64_t defaultWidth;
  undefined1 local_6a8 [64];
  undefined1 local_668 [64];
  undefined1 local_628 [64];
  undefined1 local_5e8 [64];
  undefined1 local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *local_480;
  int64 *value;
  undefined1 local_470 [4];
  int i_2;
  undefined1 local_450 [64];
  string local_410;
  undefined1 local_3e8 [4];
  int i_1;
  undefined1 local_3c8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  undefined1 local_2e0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [72];
  SizeRange *local_1f8;
  SizeRange *range;
  RepeatedPtrField<CoreML::Specification::SizeRange> *pRStack_1e8;
  int i;
  RepeatedPtrField<CoreML::Specification::SizeRange> *sizeRanges;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  reference pAStack_178;
  int d;
  ArrayFeatureType_Shape *shape_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range5_1;
  undefined1 local_150 [7];
  bool foundDefault;
  string local_130;
  ArrayFeatureType_Shape *shape;
  const_iterator __end5;
  const_iterator __begin5;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range5;
  string local_d0;
  bool hasImplictDefault;
  RepeatedField<long> *pRStack_a8;
  bool hasExplicitDefault;
  RepeatedField<long> *defaultShape;
  FeatureType *type;
  string local_78;
  allocator local_41;
  string local_40;
  bool isInput_local;
  FeatureDescription *pFStack_18;
  int modelVersion_local;
  FeatureDescription *desc_local;
  
  local_40._M_storage._M_storage[3] = isInput;
  local_40._M_storage._M_storage._4_4_ = modelVersion;
  pFStack_18 = desc;
  desc_local = (FeatureDescription *)__return_storage_ptr__;
  psVar16 = Specification::FeatureDescription::name_abi_cxx11_(desc);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar16,"");
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Feature description must have a non-empty name.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    bVar4 = Specification::FeatureDescription::has_type(pFStack_18);
    if (bVar4) {
      defaultShape = (RepeatedField<long> *)Specification::FeatureDescription::type(pFStack_18);
      TVar6 = Specification::FeatureType::Type_case((FeatureType *)defaultShape);
      switch(TVar6) {
      case TYPE_NOT_SET:
        psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
        std::operator+(&local_dd0,
                       "Feature description has an unspecified or invalid type for feature \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar16)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_db0,&local_dd0,"\'.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_db0);
        std::__cxx11::string::~string((string *)local_db0);
        std::__cxx11::string::~string((string *)&local_dd0);
        return __return_storage_ptr__;
      case kInt64Type:
      case kDoubleType:
      case kStringType:
        break;
      case kImageType:
        pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        defaultHeight = Specification::ImageFeatureType::width(pIVar23);
        pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        uStack_6d8 = Specification::ImageFeatureType::height(pIVar23);
        local_ed9 = 0 < defaultHeight && 0 < (long)uStack_6d8;
        local_700._M_storage._M_storage[7] = local_ed9;
        if (2 < (int)local_40._M_storage._M_storage._4_4_) {
          pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          SVar13 = Specification::ImageFeatureType::SizeFlexibility_case(pIVar23);
          if (SVar13 == kEnumeratedSizes) {
            pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
            pIVar24 = Specification::ImageFeatureType::enumeratedsizes(pIVar23);
            iVar7 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes_size(pIVar24);
            if (iVar7 == 0) {
              psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_720,"Description of image feature \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar16);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_700,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_720,"\' has enumerated zero permitted sizes.");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_700);
              std::__cxx11::string::~string((string *)&local_700);
              std::__cxx11::string::~string((string *)local_720);
              return __return_storage_ptr__;
            }
            if ((local_700._M_storage._M_storage[7] & 1) == 0) {
              pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar24 = Specification::ImageFeatureType::enumeratedsizes(pIVar23);
              pIVar25 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar24,0);
              defaultHeight = Specification::ImageFeatureType_ImageSize::width(pIVar25);
              pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar24 = Specification::ImageFeatureType::enumeratedsizes(pIVar23);
              pIVar25 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar24,0);
              uStack_6d8 = Specification::ImageFeatureType_ImageSize::height(pIVar25);
            }
            else {
              bVar4 = false;
              pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar24 = Specification::ImageFeatureType::enumeratedsizes(pIVar23);
              this_01 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar24);
              __end5_2 = google::protobuf::
                         RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::begin
                                   (this_01);
              size = (ImageFeatureType_ImageSize *)
                     google::protobuf::
                     RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::end
                               (this_01);
              while (bVar5 = google::protobuf::internal::
                             RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>
                             ::operator!=(&__end5_2,(iterator *)&size), bVar5) {
                local_768._M_storage._M_storage =
                     (uchar  [8])
                     google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>::
                     operator*(&__end5_2);
                iVar2 = defaultHeight;
                uVar27 = Specification::ImageFeatureType_ImageSize::width
                                   ((ImageFeatureType_ImageSize *)local_768._M_storage._M_storage);
                uVar21 = uStack_6d8;
                if ((iVar2 == uVar27) &&
                   (uVar27 = Specification::ImageFeatureType_ImageSize::height
                                       ((ImageFeatureType_ImageSize *)
                                        local_768._M_storage._M_storage), uVar21 == uVar27)) {
                  bVar4 = true;
                  break;
                }
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>::
                operator++(&__end5_2);
              }
              if (!bVar4) {
                psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_828 + 0x20),"Description of image feature \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar16);
                std::operator+(&local_7e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_828 + 0x20),"\' has a default size of ");
                std::__cxx11::to_string((string *)local_828,defaultHeight);
                std::operator+(&local_7c8,&local_7e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_828);
                std::operator+(&local_7a8,&local_7c8,anon_var_dwarf_23898b);
                std::__cxx11::to_string((string *)&widthRange,uStack_6d8);
                std::operator+(&local_788,&local_7a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &widthRange);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_768,&local_788,
                               " which is not within the allowed enumerated sizes specified.");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_768);
                std::__cxx11::string::~string((string *)&local_768);
                std::__cxx11::string::~string((string *)&local_788);
                std::__cxx11::string::~string((string *)&widthRange);
                std::__cxx11::string::~string((string *)&local_7a8);
                std::__cxx11::string::~string((string *)&local_7c8);
                std::__cxx11::string::~string((string *)local_828);
                std::__cxx11::string::~string((string *)&local_7e8);
                std::__cxx11::string::~string((string *)(local_828 + 0x20));
                return __return_storage_ptr__;
              }
            }
          }
          else if (SVar13 == kImageSizeRange) {
            pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
            pIVar26 = Specification::ImageFeatureType::imagesizerange(pIVar23);
            local_850 = Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar26);
            validateSizeRange((Result *)(local_898 + 0x20),local_850);
            bVar4 = Result::good((Result *)(local_898 + 0x20));
            if (bVar4) {
              pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar26 = Specification::ImageFeatureType::imagesizerange(pIVar23);
              local_8e0 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar26);
              validateSizeRange((Result *)(local_928 + 0x20),local_8e0);
              Result::operator=((Result *)(local_898 + 0x20),(Result *)(local_928 + 0x20));
              Result::~Result((Result *)(local_928 + 0x20));
              bVar4 = Result::good((Result *)(local_898 + 0x20));
              iVar2 = defaultHeight;
              if (bVar4) {
                if ((local_700._M_storage._M_storage[7] & 1) == 0) {
                  defaultHeight = Specification::SizeRange::lowerbound(local_850);
                  uStack_6d8 = Specification::SizeRange::lowerbound(local_8e0);
                  local_308._M_storage._M_storage[4] = '\x17';
                  local_308._M_storage._M_storage[5] = '\0';
                  local_308._M_storage._M_storage[6] = '\0';
                  local_308._M_storage._M_storage[7] = '\0';
                }
                else {
                  uVar21 = Specification::SizeRange::lowerbound(local_850);
                  if ((iVar2 < (long)uVar21) ||
                     ((iVar22 = Specification::SizeRange::upperbound(local_850),
                      iVar2 = defaultHeight, -1 < iVar22 &&
                      (iVar22 = Specification::SizeRange::upperbound(local_850), iVar22 < iVar2))))
                  {
                    psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_a08 + 0x20),"Description of image feature \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar16);
                    std::operator+(&local_9c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_a08 + 0x20),"\' default width ");
                    std::__cxx11::to_string((string *)local_a08,defaultHeight);
                    std::operator+(&local_9a8,&local_9c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a08);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_988,&local_9a8,
                                   " is not within specified flexible width range");
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,
                                   (string *)local_988);
                    std::__cxx11::string::~string((string *)local_988);
                    std::__cxx11::string::~string((string *)&local_9a8);
                    std::__cxx11::string::~string((string *)local_a08);
                    std::__cxx11::string::~string((string *)&local_9c8);
                    std::__cxx11::string::~string((string *)(local_a08 + 0x20));
                    local_308._M_storage._M_storage[4] = '\x01';
                    local_308._M_storage._M_storage[5] = '\0';
                    local_308._M_storage._M_storage[6] = '\0';
                    local_308._M_storage._M_storage[7] = '\0';
                  }
                  else {
                    uVar21 = uStack_6d8;
                    uVar27 = Specification::SizeRange::lowerbound(local_8e0);
                    if (((long)uVar21 < (long)uVar27) ||
                       ((iVar22 = Specification::SizeRange::upperbound(local_8e0),
                        uVar21 = uStack_6d8, -1 < iVar22 &&
                        (iVar22 = Specification::SizeRange::upperbound(local_8e0),
                        iVar22 < (long)uVar21)))) {
                      psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_aa8 + 0x20),"Description of image feature \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar16);
                      std::operator+(&local_a68,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_aa8 + 0x20),"\' default height ");
                      std::__cxx11::to_string((string *)local_aa8,uStack_6d8);
                      std::operator+(&local_a48,&local_a68,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_aa8);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a28,&local_a48,
                                     " is not within specified flexible height range");
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,
                                     (string *)local_a28);
                      std::__cxx11::string::~string((string *)local_a28);
                      std::__cxx11::string::~string((string *)&local_a48);
                      std::__cxx11::string::~string((string *)local_aa8);
                      std::__cxx11::string::~string((string *)&local_a68);
                      std::__cxx11::string::~string((string *)(local_aa8 + 0x20));
                      local_308._M_storage._M_storage[4] = '\x01';
                      local_308._M_storage._M_storage[5] = '\0';
                      local_308._M_storage._M_storage[6] = '\0';
                      local_308._M_storage._M_storage[7] = '\0';
                    }
                    else {
                      local_308._M_storage._M_storage[4] = '\x17';
                      local_308._M_storage._M_storage[5] = '\0';
                      local_308._M_storage._M_storage[6] = '\0';
                      local_308._M_storage._M_storage[7] = '\0';
                    }
                  }
                }
              }
              else {
                psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_988 + 0x20),"Description of image feature \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar16);
                std::operator+(&local_948,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_988 + 0x20),"\' has an invalid flexible height range. ");
                psVar16 = Result::message_abi_cxx11_((Result *)(local_898 + 0x20));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_928,&local_948,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar16);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_928);
                std::__cxx11::string::~string((string *)local_928);
                std::__cxx11::string::~string((string *)&local_948);
                std::__cxx11::string::~string((string *)(local_988 + 0x20));
                local_308._M_storage._M_storage[4] = '\x01';
                local_308._M_storage._M_storage[5] = '\0';
                local_308._M_storage._M_storage[6] = '\0';
                local_308._M_storage._M_storage[7] = '\0';
              }
            }
            else {
              psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &heightRange,"Description of image feature \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar16);
              std::operator+(&local_8b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &heightRange,"\' has an invalid flexible width range. ");
              psVar16 = Result::message_abi_cxx11_((Result *)(local_898 + 0x20));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_898,&local_8b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar16);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_898);
              std::__cxx11::string::~string((string *)local_898);
              std::__cxx11::string::~string((string *)&local_8b8);
              std::__cxx11::string::~string((string *)&heightRange);
              local_308._M_storage._M_storage[4] = '\x01';
              local_308._M_storage._M_storage[5] = '\0';
              local_308._M_storage._M_storage[6] = '\0';
              local_308._M_storage._M_storage[7] = '\0';
            }
            Result::~Result((Result *)(local_898 + 0x20));
            if (local_308._M_storage._M_storage._4_4_ == 1) {
              return __return_storage_ptr__;
            }
          }
        }
        if (defaultHeight < 1) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_b48 + 0x20),"Description of image feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+(&local_b08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_b48 + 0x20),"\' has missing or non-positive width ");
          pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          iVar22 = Specification::ImageFeatureType::width(pIVar23);
          std::__cxx11::to_string((string *)local_b48,iVar22);
          std::operator+(&local_ae8,&local_b08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b48);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_ac8,&local_ae8,".");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_ac8);
          std::__cxx11::string::~string((string *)local_ac8);
          std::__cxx11::string::~string((string *)&local_ae8);
          std::__cxx11::string::~string((string *)local_b48);
          std::__cxx11::string::~string((string *)&local_b08);
          std::__cxx11::string::~string((string *)(local_b48 + 0x20));
          return __return_storage_ptr__;
        }
        if ((long)uStack_6d8 < 1) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_be8 + 0x20),"Description of image feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+(&local_ba8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_be8 + 0x20),"\' has missing or non-positive height ");
          pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          iVar22 = Specification::ImageFeatureType::height(pIVar23);
          std::__cxx11::to_string((string *)local_be8,iVar22);
          std::operator+(&local_b88,&local_ba8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_be8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b68,&local_b88,".");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_b68);
          std::__cxx11::string::~string((string *)local_b68);
          std::__cxx11::string::~string((string *)&local_b88);
          std::__cxx11::string::~string((string *)local_be8);
          std::__cxx11::string::~string((string *)&local_ba8);
          std::__cxx11::string::~string((string *)(local_be8 + 0x20));
          return __return_storage_ptr__;
        }
        pIVar23 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        IVar14 = Specification::ImageFeatureType::colorspace(pIVar23);
        if (((IVar14 != ImageFeatureType_ColorSpace_GRAYSCALE) &&
            (IVar14 != ImageFeatureType_ColorSpace_RGB)) &&
           (IVar14 != ImageFeatureType_ColorSpace_BGR)) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c48 + 0x20),"Description of image feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c48 + 0x20),
                         "\' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_c08);
          std::__cxx11::string::~string((string *)local_c08);
          std::__cxx11::string::~string((string *)(local_c48 + 0x20));
          return __return_storage_ptr__;
        }
        break;
      case kMultiArrayType:
        pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        pRStack_a8 = Specification::ArrayFeatureType::shape(pAVar17);
        pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        iVar7 = Specification::ArrayFeatureType::shape_size(pAVar17);
        local_d0._M_storage._M_storage[7] = iVar7 != 0;
        local_d0._M_storage._M_storage[6] = 0;
        if (2 < (int)local_40._M_storage._M_storage._4_4_) {
          pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          SVar8 = Specification::ArrayFeatureType::ShapeFlexibility_case(pAVar17);
          if (SVar8 != SHAPEFLEXIBILITY_NOT_SET) {
            if (SVar8 == kEnumeratedShapes) {
              local_d0._M_storage._M_storage[6] = 1;
              pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              pAVar18 = Specification::ArrayFeatureType::enumeratedshapes(pAVar17);
              iVar7 = Specification::ArrayFeatureType_EnumeratedShapes::shapes_size(pAVar18);
              if (iVar7 == 0) {
                psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__range5,"Description of multiarray feature \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar16);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__range5,"\' has enumerated zero permitted sizes.");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d0);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&__range5);
                return __return_storage_ptr__;
              }
              pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              pAVar18 = Specification::ArrayFeatureType::enumeratedshapes(pAVar17);
              pRVar19 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar18);
              __end5 = google::protobuf::
                       RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::begin
                                 (pRVar19);
              shape = (ArrayFeatureType_Shape *)
                      google::protobuf::
                      RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::end(pRVar19);
              while (bVar4 = google::protobuf::internal::
                             RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                             ::operator!=(&__end5,(iterator *)&shape), bVar4) {
                local_130._M_storage._M_storage =
                     (uchar  [8])
                     google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                     operator*(&__end5);
                iVar7 = Specification::ArrayFeatureType_Shape::shape_size
                                  ((ArrayFeatureType_Shape *)local_130._M_storage._M_storage);
                if (iVar7 == 0) {
                  psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_150,"Description of multiarray feature \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar16);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_130,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_150,"\' has enumerated shapes with zero dimensions.");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_130);
                  std::__cxx11::string::~string((string *)&local_130);
                  std::__cxx11::string::~string((string *)local_150);
                  return __return_storage_ptr__;
                }
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::operator++
                          (&__end5);
              }
              if ((local_d0._M_storage._M_storage[7] & 1) != 0) {
                bVar4 = false;
                pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
                pAVar18 = Specification::ArrayFeatureType::enumeratedshapes(pAVar17);
                pRVar19 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar18);
                __end5_1 = google::protobuf::
                           RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::begin
                                     (pRVar19);
                shape_1 = (ArrayFeatureType_Shape *)
                          google::protobuf::
                          RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::end
                                    (pRVar19);
                while (bVar5 = google::protobuf::internal::
                               RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                               ::operator!=(&__end5_1,(iterator *)&shape_1), bVar5) {
                  pAStack_178 = google::protobuf::internal::
                                RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                                ::operator*(&__end5_1);
                  iVar7 = Specification::ArrayFeatureType_Shape::shape_size(pAStack_178);
                  iVar9 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                  if (iVar7 == iVar9) {
                    bVar4 = true;
                    local_1a0._M_storage._M_storage[4] = '\0';
                    local_1a0._M_storage._M_storage[5] = '\0';
                    local_1a0._M_storage._M_storage[6] = '\0';
                    local_1a0._M_storage._M_storage[7] = '\0';
                    for (; uVar3 = local_1a0._M_storage._M_storage._4_4_,
                        iVar7 = Specification::ArrayFeatureType_Shape::shape_size(pAStack_178),
                        (int)uVar3 < iVar7;
                        local_1a0._M_storage._M_storage._4_4_ =
                             local_1a0._M_storage._M_storage._4_4_ + 1) {
                      plVar20 = google::protobuf::RepeatedField<long>::operator[]
                                          (pRStack_a8,local_1a0._M_storage._M_storage._4_4_);
                      lVar1 = *plVar20;
                      iVar22 = Specification::ArrayFeatureType_Shape::shape
                                         (pAStack_178,local_1a0._M_storage._M_storage._4_4_);
                      if (lVar1 != iVar22) {
                        bVar4 = false;
                        break;
                      }
                    }
                    if (bVar4) break;
                  }
                  google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                  operator++(&__end5_1);
                }
                if (!bVar4) {
                  psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sizeRanges,"Description of multiarray feature \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar16);
                  std::operator+(&local_1c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sizeRanges,"\' has a default shape specified ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1a0,&local_1c0,
                                 " which is not within the allowed enumerated shapes specified.");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_1a0);
                  std::__cxx11::string::~string((string *)&local_1a0);
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::__cxx11::string::~string((string *)&sizeRanges);
                  return __return_storage_ptr__;
                }
              }
            }
            else if (SVar8 == kShapeRange) {
              local_d0._M_storage._M_storage[6] = 1;
              pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              this = Specification::ArrayFeatureType::shaperange(pAVar17);
              pRStack_1e8 = Specification::ArrayFeatureType_ShapeRange::sizeranges(this);
              for (range._4_4_ = 0; iVar7 = range._4_4_,
                  iVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                    (pRStack_1e8), iVar7 < iVar9; range._4_4_ = range._4_4_ + 1) {
                local_1f8 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            operator[](pRStack_1e8,range._4_4_);
                validateSizeRange((Result *)(local_240 + 0x20),local_1f8);
                bVar4 = Result::good((Result *)(local_240 + 0x20));
                if (!bVar4) {
                  psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_2e0 + 0x20),"Description of multiarray feature \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar16);
                  std::operator+(&local_2a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_2e0 + 0x20),"\' has an invalid range for dimension ");
                  std::__cxx11::to_string((string *)local_2e0,range._4_4_);
                  std::operator+(&local_280,&local_2a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e0);
                  std::operator+(&local_260,&local_280,". ");
                  psVar16 = Result::message_abi_cxx11_((Result *)(local_240 + 0x20));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_240,&local_260,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar16);
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_240)
                  ;
                  std::__cxx11::string::~string((string *)local_240);
                  std::__cxx11::string::~string((string *)&local_260);
                  std::__cxx11::string::~string((string *)&local_280);
                  std::__cxx11::string::~string((string *)local_2e0);
                  std::__cxx11::string::~string((string *)&local_2a0);
                  std::__cxx11::string::~string((string *)(local_2e0 + 0x20));
                }
                local_308._M_storage._M_storage._5_3_ = 0;
                local_308._M_storage._M_storage[4] = !bVar4;
                Result::~Result((Result *)(local_240 + 0x20));
                if (local_308._M_storage._M_storage._4_4_ != 0) {
                  return __return_storage_ptr__;
                }
              }
              if ((local_d0._M_storage._M_storage[7] & 1) != 0) {
                iVar7 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                iVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                  (pRStack_1e8);
                if (iVar7 != iVar9) {
                  psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3c8 + 0x20),"Description of multiarray feature \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar16);
                  std::operator+(&local_388,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3c8 + 0x20),"\' has a default ");
                  iVar7 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                  std::__cxx11::to_string((string *)local_3c8,iVar7);
                  std::operator+(&local_368,&local_388,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3c8);
                  std::operator+(&local_348,&local_368,"-d shape but a ");
                  iVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                    (pRStack_1e8);
                  std::__cxx11::to_string((string *)local_3e8,iVar7);
                  std::operator+(&local_328,&local_348,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3e8);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_308,&local_328,"-d shape range");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_308);
                  std::__cxx11::string::~string((string *)&local_308);
                  std::__cxx11::string::~string((string *)&local_328);
                  std::__cxx11::string::~string((string *)local_3e8);
                  std::__cxx11::string::~string((string *)&local_348);
                  std::__cxx11::string::~string((string *)&local_368);
                  std::__cxx11::string::~string((string *)local_3c8);
                  std::__cxx11::string::~string((string *)&local_388);
                  std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
                  return __return_storage_ptr__;
                }
                local_410._M_storage._M_storage[4] = '\0';
                local_410._M_storage._M_storage[5] = '\0';
                local_410._M_storage._M_storage[6] = '\0';
                local_410._M_storage._M_storage[7] = '\0';
                for (; uVar3 = local_410._M_storage._M_storage._4_4_,
                    iVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            size(pRStack_1e8), (int)uVar3 < iVar7;
                    local_410._M_storage._M_storage._4_4_ =
                         local_410._M_storage._M_storage._4_4_ + 1) {
                  plVar20 = google::protobuf::RepeatedField<long>::operator[]
                                      (pRStack_a8,local_410._M_storage._M_storage._4_4_);
                  lVar1 = *plVar20;
                  pSVar29 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            operator[](pRStack_1e8,local_410._M_storage._M_storage._4_4_);
                  uVar21 = Specification::SizeRange::lowerbound(pSVar29);
                  if (lVar1 < (int)uVar21) {
LAB_0036a47c:
                    psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_450 + 0x20),"Description of multiarray feature \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar16);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_410,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_450 + 0x20),
                                   "\' has a default shape that is out of the specified shape range"
                                  );
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_410);
                    std::__cxx11::string::~string((string *)&local_410);
                    std::__cxx11::string::~string((string *)(local_450 + 0x20));
                    return __return_storage_ptr__;
                  }
                  pSVar29 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            operator[](pRStack_1e8,local_410._M_storage._M_storage._4_4_);
                  iVar22 = Specification::SizeRange::upperbound(pSVar29);
                  if (-1 < iVar22) {
                    plVar20 = google::protobuf::RepeatedField<long>::operator[]
                                        (pRStack_a8,local_410._M_storage._M_storage._4_4_);
                    lVar1 = *plVar20;
                    pSVar29 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                              operator[](pRStack_1e8,local_410._M_storage._M_storage._4_4_);
                    iVar22 = Specification::SizeRange::upperbound(pSVar29);
                    if (iVar22 < lVar1) goto LAB_0036a47c;
                  }
                }
              }
            }
          }
        }
        if ((((local_40._M_storage._M_storage[3] & 1) != 0) &&
            ((local_d0._M_storage._M_storage[7] & 1) == 0)) &&
           ((local_d0._M_storage._M_storage[6] & 1) == 0)) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_470,"Description of multiarray feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_470,"\' has missing shape constraints.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_450);
          std::__cxx11::string::~string((string *)local_450);
          std::__cxx11::string::~string((string *)local_470);
          return __return_storage_ptr__;
        }
        if ((local_d0._M_storage._M_storage[7] & 1) != 0) {
          value._4_4_ = 0;
          while( true ) {
            iVar7 = value._4_4_;
            pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
            iVar9 = Specification::ArrayFeatureType::shape_size(pAVar17);
            if (iVar9 <= iVar7) break;
            pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
            local_4a8._M_storage._M_storage =
                 (uchar  [8])Specification::ArrayFeatureType::shape(pAVar17,value._4_4_);
            local_480 = &local_4a8._M_storage;
            if ((long)local_4a8._M_storage._M_storage < 0) {
              psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_568 + 0x20),"Description of multiarray feature \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar16);
              std::operator+(&local_528,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_568 + 0x20),"\' has an invalid shape. Element ");
              std::__cxx11::to_string((string *)local_568,value._4_4_);
              std::operator+(&local_508,&local_528,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_568);
              std::operator+(&local_4e8,&local_508," has non-positive value ");
              std::__cxx11::to_string((string *)local_588,*(long *)local_480->_M_storage);
              std::operator+(&local_4c8,&local_4e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_588);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_4a8,&local_4c8,".");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_4a8);
              std::__cxx11::string::~string((string *)&local_4a8);
              std::__cxx11::string::~string((string *)&local_4c8);
              std::__cxx11::string::~string((string *)local_588);
              std::__cxx11::string::~string((string *)&local_4e8);
              std::__cxx11::string::~string((string *)&local_508);
              std::__cxx11::string::~string((string *)local_568);
              std::__cxx11::string::~string((string *)&local_528);
              std::__cxx11::string::~string((string *)(local_568 + 0x20));
              return __return_storage_ptr__;
            }
            value._4_4_ = value._4_4_ + 1;
          }
        }
        pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        AVar10 = Specification::ArrayFeatureType::datatype(pAVar17);
        if (((AVar10 != ArrayFeatureType_ArrayDataType_FLOAT32) &&
            (AVar10 != ArrayFeatureType_ArrayDataType_DOUBLE)) &&
           (AVar10 != ArrayFeatureType_ArrayDataType_INT32)) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_5e8 + 0x20),"Description of multiarray feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_5e8 + 0x20),
                         "\' has an invalid or unspecified dataType. It must be specified as DOUBLE, FLOAT32 or INT32"
                        );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_5a8);
          std::__cxx11::string::~string((string *)local_5a8);
          std::__cxx11::string::~string((string *)(local_5e8 + 0x20));
          return __return_storage_ptr__;
        }
        pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        DVar11 = Specification::ArrayFeatureType::defaultOptionalValue_case(pAVar17);
        if (DVar11 == kIntDefaultValue) {
          pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar10 = Specification::ArrayFeatureType::datatype(pAVar17);
          if (AVar10 != ArrayFeatureType_ArrayDataType_INT32) {
            psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6a8 + 0x20),"Description of multiarray feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_668,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6a8 + 0x20),
                           "\' has mistmatch between dataType and the type of default optional value."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_668);
            std::__cxx11::string::~string((string *)local_668);
            std::__cxx11::string::~string((string *)(local_6a8 + 0x20));
            return __return_storage_ptr__;
          }
        }
        else if (DVar11 == kFloatDefaultValue) {
          pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar10 = Specification::ArrayFeatureType::datatype(pAVar17);
          if (AVar10 != ArrayFeatureType_ArrayDataType_FLOAT32) {
            psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_668 + 0x20),"Description of multiarray feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_628,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_668 + 0x20),
                           "\' has mistmatch between dataType and the type of default optional value."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_628);
            std::__cxx11::string::~string((string *)local_628);
            std::__cxx11::string::~string((string *)(local_668 + 0x20));
            return __return_storage_ptr__;
          }
        }
        else if (DVar11 == kDoubleDefaultValue) {
          pAVar17 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar10 = Specification::ArrayFeatureType::datatype(pAVar17);
          if (AVar10 != ArrayFeatureType_ArrayDataType_DOUBLE) {
            psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_628 + 0x20),"Description of multiarray feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_628 + 0x20),
                           "\' has mistmatch between dataType and the type of default optional value."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_5e8);
            std::__cxx11::string::~string((string *)local_5e8);
            std::__cxx11::string::~string((string *)(local_628 + 0x20));
            return __return_storage_ptr__;
          }
        }
        break;
      case kDictionaryType:
        this_00 = Specification::FeatureType::dictionarytype((FeatureType *)defaultShape);
        KVar12 = Specification::DictionaryFeatureType::KeyType_case(this_00);
        if (KVar12 == KEYTYPE_NOT_SET) {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defaultWidth,"Description of dictionary feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defaultWidth,"\' must contain a key type of either Int64 or String.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_6a8);
          std::__cxx11::string::~string((string *)local_6a8);
          std::__cxx11::string::~string((string *)&defaultWidth);
          return __return_storage_ptr__;
        }
        break;
      case kSequenceType:
        if ((int)local_40._M_storage._M_storage._4_4_ < 3) {
          std::__cxx11::to_string((string *)local_ca8,3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_ca8 + 0x20),
                         "Sequence types are only valid in specification verison >= ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_ca8);
          std::operator+(&local_c68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_ca8 + 0x20),". This model has version ");
          std::__cxx11::to_string
                    ((string *)&res_2.m_message.super__Rb_tree_node_base._M_right,
                     local_40._M_storage._M_storage._4_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c48,&local_c68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &res_2.m_message.super__Rb_tree_node_base._M_right);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_c48);
          std::__cxx11::string::~string((string *)local_c48);
          std::__cxx11::string::~string
                    ((string *)&res_2.m_message.super__Rb_tree_node_base._M_right);
          std::__cxx11::string::~string((string *)&local_c68);
          std::__cxx11::string::~string((string *)(local_ca8 + 0x20));
          std::__cxx11::string::~string((string *)local_ca8);
          return __return_storage_ptr__;
        }
        pSVar28 = Specification::FeatureType::sequencetype((FeatureType *)defaultShape);
        pSVar29 = Specification::SequenceFeatureType::sizerange(pSVar28);
        validateSizeRange((Result *)(local_d10 + 0x20),pSVar29);
        bVar4 = Result::good((Result *)(local_d10 + 0x20));
        if (bVar4) {
          pSVar28 = Specification::FeatureType::sequencetype((FeatureType *)defaultShape);
          TVar15 = Specification::SequenceFeatureType::Type_case(pSVar28);
          if (TVar15 == TYPE_NOT_SET) {
            psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_db0 + 0x20),"Description of sequence feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_db0 + 0x20),
                           "\' has invalid or missing type. Only Int64 and String sequences are currently supported"
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_d70);
            std::__cxx11::string::~string((string *)local_d70);
            std::__cxx11::string::~string((string *)(local_db0 + 0x20));
            local_308._M_storage._M_storage[4] = '\x01';
            local_308._M_storage._M_storage[5] = '\0';
            local_308._M_storage._M_storage[6] = '\0';
            local_308._M_storage._M_storage[7] = '\0';
          }
          else {
            local_308._M_storage._M_storage[4] = '\x02';
            local_308._M_storage._M_storage[5] = '\0';
            local_308._M_storage._M_storage[6] = '\0';
            local_308._M_storage._M_storage[7] = '\0';
          }
        }
        else {
          psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_d70 + 0x20),"Description of sequence feature \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          std::operator+(&local_d30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_d70 + 0x20),"\' has invalid allowed sizes. ");
          psVar16 = Result::message_abi_cxx11_((Result *)(local_d10 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d10,&local_d30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar16);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_d10);
          std::__cxx11::string::~string((string *)local_d10);
          std::__cxx11::string::~string((string *)&local_d30);
          std::__cxx11::string::~string((string *)(local_d70 + 0x20));
          local_308._M_storage._M_storage[4] = '\x01';
          local_308._M_storage._M_storage[5] = '\0';
          local_308._M_storage._M_storage[6] = '\0';
          local_308._M_storage._M_storage[7] = '\0';
        }
        Result::~Result((Result *)(local_d10 + 0x20));
        if (local_308._M_storage._M_storage._4_4_ == 1) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      psVar16 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     "Feature description ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar16);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     " must specify a valid feature type.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&type);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }